

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O1

bool crnlib::texture_conversion::dxt_progress_callback_func
               (uint percentage_complete,void *pUser_data_ptr)

{
  code *pcVar1;
  char cVar2;
  progress_params *params;
  int iVar3;
  int iVar4;
  
  if (*(char *)((long)pUser_data_ptr + 0xc) != '\0') {
    return false;
  }
  pcVar1 = *(code **)(*pUser_data_ptr + 0x3f8);
  if (pcVar1 == (code *)0x0) {
    cVar2 = '\x01';
  }
  else {
    iVar4 = ((100 - *(int *)((long)pUser_data_ptr + 8)) * percentage_complete) / 100 +
            *(int *)((long)pUser_data_ptr + 8);
    if (99 < iVar4) {
      iVar4 = 100;
    }
    iVar3 = 0;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    cVar2 = (*pcVar1)(iVar3,*(undefined8 *)(*pUser_data_ptr + 0x400));
    if (cVar2 == '\0') {
      *(undefined1 *)((long)pUser_data_ptr + 0xc) = 1;
    }
  }
  return (bool)cVar2;
}

Assistant:

static bool dxt_progress_callback_func(uint percentage_complete, void* pUser_data_ptr) {
  progress_params& params = *static_cast<progress_params*>(pUser_data_ptr);

  if (params.m_canceled)
    return false;

  if (!params.m_pParams->m_pProgress_func)
    return true;

  int scaled_percentage_complete = params.m_start_percentage + (percentage_complete * (100 - params.m_start_percentage)) / 100;

  scaled_percentage_complete = math::clamp<int>(scaled_percentage_complete, 0, 100);

  if (!params.m_pParams->m_pProgress_func(scaled_percentage_complete, params.m_pParams->m_pProgress_user_data)) {
    params.m_canceled = true;
    return false;
  }

  return true;
}